

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argagg.hpp
# Opt level: O1

bool argagg::convert::parse_next_component<double>(char **s,double *out_arg,char delim)

{
  char *__s;
  char *pcVar1;
  undefined7 in_register_00000011;
  double dVar2;
  string arg_str;
  allocator local_49;
  char *local_48 [2];
  char local_38 [16];
  
  __s = *s;
  pcVar1 = strchr(__s,(int)CONCAT71(in_register_00000011,delim));
  *s = pcVar1;
  if (pcVar1 == (char *)0x0) {
    std::__cxx11::string::string((string *)local_48,__s,&local_49);
    dVar2 = arg<double>(local_48[0]);
    *out_arg = dVar2;
    if (local_48[0] == local_38) goto LAB_0013d994;
  }
  else {
    local_48[0] = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,__s,pcVar1);
    dVar2 = arg<double>(local_48[0]);
    *out_arg = dVar2;
    *s = *s + 1;
    if (local_48[0] == local_38) goto LAB_0013d994;
  }
  operator_delete(local_48[0]);
LAB_0013d994:
  return pcVar1 != (char *)0x0;
}

Assistant:

bool parse_next_component(
    const char*& s,
    T& out_arg,
    const char delim)
  {
    const char* begin = s;
    s = std::strchr(s, delim);
    if (s == nullptr) {
      std::string arg_str(begin);
      out_arg = argagg::convert::arg<T>(arg_str.c_str());
      return false;
    } else {
      std::string arg_str(begin, s - begin);
      out_arg = argagg::convert::arg<T>(arg_str.c_str());
      s += 1;
      return true;
    }
  }